

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.h
# Opt level: O0

uint64_t xNextLong(Xoroshiro *xr)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t n;
  uint64_t h;
  uint64_t l;
  Xoroshiro *xr_local;
  
  uVar1 = xr->lo;
  uVar2 = uVar1 + xr->hi;
  uVar3 = uVar1 ^ xr->hi;
  xr->lo = (uVar1 << 0x31 | uVar1 >> 0xf) ^ uVar3 ^ uVar3 << 0x15;
  xr->hi = uVar3 << 0x1c | uVar3 >> 0x24;
  return (uVar2 * 0x20000 | uVar2 >> 0x2f) + uVar1;
}

Assistant:

static inline uint64_t xNextLong(Xoroshiro *xr)
{
    uint64_t l = xr->lo;
    uint64_t h = xr->hi;
    uint64_t n = rotl64(l + h, 17) + l;
    h ^= l;
    xr->lo = rotl64(l, 49) ^ h ^ (h << 21);
    xr->hi = rotl64(h, 28);
    return n;
}